

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

ParamsStream<VectorWriter_&,_CNetAddr::SerParams> * __thiscall
ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
          (ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *os;
  
  os = *(ParamsStream<VectorWriter_&,_CNetAddr::SerParams> **)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<VectorWriter&,CNetAddr::SerParams>,16u,unsigned_char>(os,in_RDI);
  if (*(ParamsStream<VectorWriter_&,_CNetAddr::SerParams> **)(in_FS_OFFSET + 0x28) == os) {
    return (ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

void write(Span<const std::byte> src) { GetStream().write(src); }